

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Metadata * kj::anon_unknown_8::statToMetadata(Metadata *__return_storage_ptr__,stat *stats)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  __nlink_t _Var7;
  Type TVar8;
  
  uVar1 = stats->st_dev;
  uVar2 = stats->st_ino;
  TVar8 = modeToType(stats->st_mode);
  uVar3 = stats->st_size;
  lVar4 = stats->st_blocks;
  lVar5 = (stats->st_mtim).tv_sec;
  lVar6 = (stats->st_mtim).tv_nsec;
  _Var7 = stats->st_nlink;
  __return_storage_ptr__->type = TVar8;
  __return_storage_ptr__->size = uVar3;
  __return_storage_ptr__->spaceUsed = lVar4 << 9;
  (__return_storage_ptr__->lastModified).value.value = lVar5 * 1000000000 + lVar6;
  __return_storage_ptr__->linkCount = (uint)_Var7;
  __return_storage_ptr__->hashCode = (uVar1 << 0x20 | uVar1 >> 0x20) ^ uVar2;
  return __return_storage_ptr__;
}

Assistant:

static FsNode::Metadata statToMetadata(struct stat& stats) {
  // Probably st_ino and st_dev are usually under 32 bits, so mix by rotating st_dev left 32 bits
  // and XOR.
  uint64_t d = stats.st_dev;
  uint64_t hash = ((d << 32) | (d >> 32)) ^ stats.st_ino;

  return FsNode::Metadata {
    modeToType(stats.st_mode),
    implicitCast<uint64_t>(stats.st_size),
    implicitCast<uint64_t>(stats.st_blocks * 512u),
#if __APPLE__
    toKjDate(stats.st_mtimespec),
#else
    toKjDate(stats.st_mtim),
#endif
    implicitCast<uint>(stats.st_nlink),
    hash
  };
}